

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::initialiseDevexFramework(HEkkPrimal *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  HEkkPrimal *in_RDI;
  HighsInt nonbasicFlag;
  HighsInt iCol;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_18;
  
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
             ,(value_type_conflict1 *)0x7a7f19);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
             ,(value_type_conflict2 *)0x7a7f3e);
  for (local_18 = 0; local_18 < in_RDI->num_tot; local_18 = local_18 + 1) {
    pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&(in_RDI->ekk_instance_->basis_).nonbasicFlag_,(long)local_18);
    iVar1 = (int)*pvVar2 * (int)*pvVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->devex_index_,(long)local_18);
    *pvVar3 = iVar1;
  }
  in_RDI->num_devex_iterations_ = 0;
  in_RDI->num_bad_devex_weight_ = 0;
  if ((in_RDI->report_hyper_chuzc & 1U) != 0) {
    printf("initialiseDevexFramework\n");
  }
  hyperChooseColumnClear(in_RDI);
  return;
}

Assistant:

void HEkkPrimal::initialiseDevexFramework() {
  edge_weight_.assign(num_tot, 1.0);
  devex_index_.assign(num_tot, 0);
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    const HighsInt nonbasicFlag = ekk_instance_.basis_.nonbasicFlag_[iCol];
    devex_index_[iCol] = nonbasicFlag * nonbasicFlag;
  }
  num_devex_iterations_ = 0;
  num_bad_devex_weight_ = 0;
  if (report_hyper_chuzc) printf("initialiseDevexFramework\n");
  hyperChooseColumnClear();
}